

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Execute<int,double,duckdb::ArgMinMaxState<int,double>>
               (ArgMinMaxState<int,_double> *state,int x_data,double y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  double *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  TemplatedValidityMask<unsigned_long> *in_XMM0_Qa;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_XMM0_Qa,(idx_t)in_RDX);
  if ((bVar1) &&
     (bVar1 = duckdb::GreaterThan::Operation<double>
                        ((double *)&stack0xffffffffffffffe8,(double *)(in_RDI + 8)), bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_XMM0_Qa,(idx_t)in_RDX);
    Assign<int,double,duckdb::ArgMinMaxState<int,double>>
              ((ArgMinMaxState<int,_double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (int *)in_XMM0_Qa,in_RDX,SUB81((ulong)in_RDI >> 0x38,0));
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}